

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean guard_check(AD *ad)

{
  Pointer guard;
  Guard signature;
  AD *ad_local;
  Boolean local_8;
  
  if (*(int *)(ad->client_space + -4) == -0x55555556) {
    if (*(int *)(ad->client_space + ad->nelem * (long)ma_sizeof[ad->datatype]) == 0x55555555) {
      local_8 = 1;
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

private Boolean guard_check(ad)
    AD        *ad;        /* the AD to check guards for */
{
    Guard    signature;    /* value to be read */
    Pointer    guard;        /* address to read from */

    guard = guard1(ad);
    guard_read(guard, &signature);
    if (signature != GUARD1)
        return MA_FALSE;

    guard = guard2(ad);
    guard_read(guard, &signature);
    if (signature != GUARD2)
        return MA_FALSE;

    /* success */
    return MA_TRUE;
}